

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btConvexHull.cpp
# Opt level: O0

int * __thiscall btHullTriangle::neib(btHullTriangle *this,int a,int b)

{
  int *piVar1;
  int in_EDX;
  int i_00;
  int i_01;
  int in_ESI;
  int3 *in_RDI;
  int i2;
  int i1;
  int i;
  int local_1c;
  
  local_1c = 0;
  while( true ) {
    if (2 < local_1c) {
      return &neib::er;
    }
    i_00 = (local_1c + 1) % 3;
    i_01 = (local_1c + 2) % 3;
    piVar1 = int3::operator[](in_RDI,local_1c);
    if ((*piVar1 == in_ESI) && (piVar1 = int3::operator[](in_RDI,i_00), *piVar1 == in_EDX)) break;
    piVar1 = int3::operator[](in_RDI,local_1c);
    if ((*piVar1 == in_EDX) && (piVar1 = int3::operator[](in_RDI,i_00), *piVar1 == in_ESI)) {
      piVar1 = int3::operator[](in_RDI + 1,i_01);
      return piVar1;
    }
    local_1c = local_1c + 1;
  }
  piVar1 = int3::operator[](in_RDI + 1,i_01);
  return piVar1;
}

Assistant:

int &btHullTriangle::neib(int a,int b)
{
	static int er=-1;
	int i;
	for(i=0;i<3;i++) 
	{
		int i1=(i+1)%3;
		int i2=(i+2)%3;
		if((*this)[i]==a && (*this)[i1]==b) return n[i2];
		if((*this)[i]==b && (*this)[i1]==a) return n[i2];
	}
	btAssert(0);
	return er;
}